

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int write_directory_descriptors(archive_write *a,vdd *vdd)

{
  int iVar1;
  uchar *__dest;
  uchar *wb;
  extr_rec *extr;
  int r;
  int depth;
  isoent *np;
  vdd *vdd_local;
  archive_write *a_local;
  
  extr._4_4_ = 0;
  _r = vdd->rootent;
  do {
    iVar1 = _write_directory_descriptors(a,vdd,_r,extr._4_4_);
    if (iVar1 < 0) {
      return iVar1;
    }
    if (vdd->vdd_type != VDD_JOLIET) {
      for (wb = (uchar *)(_r->extr_rec_list).first; wb != (uchar *)0x0; wb = *(uchar **)(wb + 0x808)
          ) {
        __dest = wb_buffptr(a);
        memcpy(__dest,wb + 8,(long)*(int *)(wb + 4));
        memset(__dest + *(int *)(wb + 4),0,(long)(0x800 - *(int *)(wb + 4)));
        iVar1 = wb_consume(a,0x800);
        if (iVar1 < 0) {
          return iVar1;
        }
      }
    }
    if (((_r->subdirs).first == (isoent *)0x0) || (vdd->max_depth <= extr._4_4_ + 1)) {
      for (; _r != _r->parent; _r = _r->parent) {
        if (_r->drnext != (isoent *)0x0) {
          _r = _r->drnext;
          break;
        }
        extr._4_4_ = extr._4_4_ + -1;
      }
    }
    else {
      _r = (_r->subdirs).first;
      extr._4_4_ = extr._4_4_ + 1;
    }
    if (_r == _r->parent) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
write_directory_descriptors(struct archive_write *a, struct vdd *vdd)
{
	struct isoent *np;
	int depth, r;

	depth = 0;
	np = vdd->rootent;
	do {
		struct extr_rec *extr;

		r = _write_directory_descriptors(a, vdd, np, depth);
		if (r < 0)
			return (r);
		if (vdd->vdd_type != VDD_JOLIET) {
			/*
			 * This extract record is used by SUSP,RRIP.
			 * Not for joliet.
			 */
			for (extr = np->extr_rec_list.first;
			    extr != NULL;
			    extr = extr->next) {
				unsigned char *wb;

				wb = wb_buffptr(a);
				memcpy(wb, extr->buf, extr->offset);
				memset(wb + extr->offset, 0,
				    LOGICAL_BLOCK_SIZE - extr->offset);
				r = wb_consume(a, LOGICAL_BLOCK_SIZE);
				if (r < 0)
					return (r);
			}
		}

		if (np->subdirs.first != NULL && depth + 1 < vdd->max_depth) {
			/* Enter to sub directories. */
			np = np->subdirs.first;
			depth++;
			continue;
		}
		while (np != np->parent) {
			if (np->drnext == NULL) {
				/* Return to the parent directory. */
				np = np->parent;
				depth--;
			} else {
				np = np->drnext;
				break;
			}
		}
	} while (np != np->parent);

	return (ARCHIVE_OK);
}